

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator __thiscall
QHash<unsigned_long_long,QSslServerPrivate::SocketData>::
emplace<QMetaObject::Connection&,QMetaObject::Connection&,std::shared_ptr<QTimer>>
          (QHash<unsigned_long_long,_QSslServerPrivate::SocketData> *this,unsigned_long_long *key,
          Connection *args,Connection *args_1,shared_ptr<QTimer> *args_2)

{
  bool bVar1;
  SocketData *in_RCX;
  QHash<unsigned_long_long,_QSslServerPrivate::SocketData> *in_RDX;
  SocketData *in_RSI;
  Connection *in_RDI;
  QHash<unsigned_long_long,_QSslServerPrivate::SocketData> *in_R8;
  long in_FS_OFFSET;
  QHash<unsigned_long_long,_QSslServerPrivate::SocketData> copy;
  QHash<unsigned_long_long,_QSslServerPrivate::SocketData> *in_stack_ffffffffffffff68;
  SocketData *in_stack_ffffffffffffff70;
  shared_ptr<QTimer> *in_stack_ffffffffffffff78;
  piter local_50;
  Connection local_38;
  Connection local_30 [5];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QHash<unsigned_long_long,_QSslServerPrivate::SocketData>::isDetached
                    ((QHash<unsigned_long_long,_QSslServerPrivate::SocketData> *)
                     in_stack_ffffffffffffff70);
  if (bVar1) {
    bVar1 = QHashPrivate::
            Data<QHashPrivate::Node<unsigned_long_long,_QSslServerPrivate::SocketData>_>::shouldGrow
                      ((Data<QHashPrivate::Node<unsigned_long_long,_QSslServerPrivate::SocketData>_>
                        *)in_RDI->d_ptr);
    if (bVar1) {
      QMetaObject::Connection::Connection(local_30,(Connection *)in_RDX);
      QMetaObject::Connection::Connection(&local_38,&in_RCX->readyReadConnection);
      QSslServerPrivate::SocketData::SocketData
                (in_RCX,(Connection *)in_R8,in_RDI,(shared_ptr<QTimer> *)in_RSI);
      local_50 = (piter)QHash<unsigned_long_long,_QSslServerPrivate::SocketData>::
                        emplace_helper<QSslServerPrivate::SocketData>
                                  (in_R8,(unsigned_long_long *)in_RDI,in_RSI);
      QSslServerPrivate::SocketData::~SocketData(in_stack_ffffffffffffff70);
      QMetaObject::Connection::~Connection(&local_38);
      QMetaObject::Connection::~Connection(local_30);
    }
    else {
      local_50 = (piter)emplace_helper<QMetaObject::Connection&,QMetaObject::Connection&,std::shared_ptr<QTimer>>
                                  (in_RDX,(unsigned_long_long *)in_RCX,(Connection *)in_R8,in_RDI,
                                   in_stack_ffffffffffffff78);
    }
  }
  else {
    QHash<unsigned_long_long,_QSslServerPrivate::SocketData>::QHash
              ((QHash<unsigned_long_long,_QSslServerPrivate::SocketData> *)in_stack_ffffffffffffff70
               ,in_stack_ffffffffffffff68);
    QHash<unsigned_long_long,_QSslServerPrivate::SocketData>::detach
              ((QHash<unsigned_long_long,_QSslServerPrivate::SocketData> *)in_stack_ffffffffffffff70
              );
    local_50 = (piter)emplace_helper<QMetaObject::Connection&,QMetaObject::Connection&,std::shared_ptr<QTimer>>
                                (in_RDX,(unsigned_long_long *)in_RCX,(Connection *)in_R8,in_RDI,
                                 in_stack_ffffffffffffff78);
    QHash<unsigned_long_long,_QSslServerPrivate::SocketData>::~QHash
              ((QHash<unsigned_long_long,_QSslServerPrivate::SocketData> *)in_stack_ffffffffffffff70
              );
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_50;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }